

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Resize
          (KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,map_index_t new_num_buckets)

{
  uint n;
  bool bVar1;
  map_index_t mVar2;
  TableEntryPtr *pTVar3;
  anon_enum_32 *v2;
  LogMessage *pLVar4;
  TableEntryPtr *pTVar5;
  NodeBase *node;
  TreeForMap *tree;
  undefined1 auVar6 [16];
  uint local_64;
  map_index_t i;
  map_index_t start;
  map_index_t old_table_size;
  TableEntryPtr *old_table;
  LogMessageFatal local_40 [23];
  Voidify local_29;
  anon_enum_32 local_28;
  uint local_24;
  string *local_20;
  string *absl_log_internal_check_op_result;
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pKStack_10;
  map_index_t new_num_buckets_local;
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  absl_log_internal_check_op_result._4_4_ = new_num_buckets;
  pKStack_10 = this;
  if ((this->super_UntypedMapBase).num_buckets_ == 1) {
    (this->super_UntypedMapBase).index_of_first_non_null_ = 2;
    (this->super_UntypedMapBase).num_buckets_ = 2;
    pTVar3 = UntypedMapBase::CreateEmptyTable
                       (&this->super_UntypedMapBase,(this->super_UntypedMapBase).num_buckets_);
    (this->super_UntypedMapBase).table_ = pTVar3;
    mVar2 = UntypedMapBase::Seed(&this->super_UntypedMapBase);
    (this->super_UntypedMapBase).seed_ = mVar2;
  }
  else {
    local_24 = absl::lts_20240722::log_internal::GetReferenceableValue(new_num_buckets);
    local_28 = kMinTableSize;
    v2 = absl::lts_20240722::log_internal::
         GetReferenceableValue<google::protobuf::internal::UntypedMapBase::_unnamed_type_1_>
                   (&local_28);
    local_20 = absl::lts_20240722::log_internal::
               Check_GEImpl<unsigned_int,google::protobuf::internal::UntypedMapBase::_unnamed_type_1_>
                         (&local_24,v2,"new_num_buckets >= kMinTableSize");
    if (local_20 != (string *)0x0) {
      auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/map.h"
                 ,0x44a,auVar6._0_8_,auVar6._8_8_);
      pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_29,pLVar4);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
    }
    pTVar3 = (this->super_UntypedMapBase).table_;
    n = (this->super_UntypedMapBase).num_buckets_;
    (this->super_UntypedMapBase).num_buckets_ = absl_log_internal_check_op_result._4_4_;
    pTVar5 = UntypedMapBase::CreateEmptyTable
                       (&this->super_UntypedMapBase,(this->super_UntypedMapBase).num_buckets_);
    (this->super_UntypedMapBase).table_ = pTVar5;
    local_64 = (this->super_UntypedMapBase).index_of_first_non_null_;
    (this->super_UntypedMapBase).index_of_first_non_null_ =
         (this->super_UntypedMapBase).num_buckets_;
    for (; local_64 < n; local_64 = local_64 + 1) {
      bVar1 = TableEntryIsNonEmptyList(pTVar3[local_64]);
      if (bVar1) {
        node = TableEntryToNode(pTVar3[local_64]);
        TransferList(this,(KeyNode *)node);
      }
      else {
        bVar1 = TableEntryIsTree(pTVar3[local_64]);
        if (bVar1) {
          tree = TableEntryToTree(pTVar3[local_64]);
          UntypedMapBase::TransferTree(&this->super_UntypedMapBase,tree,NodeToVariantKey);
        }
      }
    }
    UntypedMapBase::DeleteTable(&this->super_UntypedMapBase,pTVar3,n);
  }
  return;
}

Assistant:

void Resize(map_index_t new_num_buckets) {
    if (num_buckets_ == kGlobalEmptyTableSize) {
      // This is the global empty array.
      // Just overwrite with a new one. No need to transfer or free anything.
      num_buckets_ = index_of_first_non_null_ = kMinTableSize;
      table_ = CreateEmptyTable(num_buckets_);
      seed_ = Seed();
      return;
    }

    ABSL_DCHECK_GE(new_num_buckets, kMinTableSize);
    const auto old_table = table_;
    const map_index_t old_table_size = num_buckets_;
    num_buckets_ = new_num_buckets;
    table_ = CreateEmptyTable(num_buckets_);
    const map_index_t start = index_of_first_non_null_;
    index_of_first_non_null_ = num_buckets_;
    for (map_index_t i = start; i < old_table_size; ++i) {
      if (internal::TableEntryIsNonEmptyList(old_table[i])) {
        TransferList(static_cast<KeyNode*>(TableEntryToNode(old_table[i])));
      } else if (internal::TableEntryIsTree(old_table[i])) {
        this->TransferTree(TableEntryToTree(old_table[i]), NodeToVariantKey);
      }
    }
    DeleteTable(old_table, old_table_size);
  }